

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.hpp
# Opt level: O3

void __thiscall sqlite::Database::Database(Database *this,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  sqlite3 *psVar3;
  anon_class_32_1_89901123 local_38;
  
  paVar1 = &local_38.path.field_2;
  pcVar2 = (path->_M_dataplus)._M_p;
  local_38.path._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar2,pcVar2 + path->_M_string_length);
  psVar3 = Database::anon_class_32_1_89901123::operator()(&local_38);
  *(code **)((long)&(this->db)._M_t.super___uniq_ptr_impl<sqlite3,_std::function<void_(sqlite3_*)>_>
                    ._M_t.super__Tuple_impl<0UL,_sqlite3_*,_std::function<void_(sqlite3_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(sqlite3_*)>_>.
                    super__Head_base<1UL,_std::function<void_(sqlite3_*)>,_false> + 0x18) =
       std::
       _Function_handler<void_(sqlite3_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././database.hpp:52:13)>
       ::_M_invoke;
  *(undefined8 *)
   &(this->db)._M_t.super___uniq_ptr_impl<sqlite3,_std::function<void_(sqlite3_*)>_>._M_t.
    super__Tuple_impl<0UL,_sqlite3_*,_std::function<void_(sqlite3_*)>_>.
    super__Tuple_impl<1UL,_std::function<void_(sqlite3_*)>_>.
    super__Head_base<1UL,_std::function<void_(sqlite3_*)>,_false> = 0;
  *(undefined8 *)
   ((long)&(this->db)._M_t.super___uniq_ptr_impl<sqlite3,_std::function<void_(sqlite3_*)>_>._M_t.
           super__Tuple_impl<0UL,_sqlite3_*,_std::function<void_(sqlite3_*)>_>.
           super__Tuple_impl<1UL,_std::function<void_(sqlite3_*)>_>.
           super__Head_base<1UL,_std::function<void_(sqlite3_*)>,_false> + 8) = 0;
  *(code **)((long)&(this->db)._M_t.super___uniq_ptr_impl<sqlite3,_std::function<void_(sqlite3_*)>_>
                    ._M_t.super__Tuple_impl<0UL,_sqlite3_*,_std::function<void_(sqlite3_*)>_>.
                    super__Tuple_impl<1UL,_std::function<void_(sqlite3_*)>_>.
                    super__Head_base<1UL,_std::function<void_(sqlite3_*)>,_false> + 0x10) =
       std::
       _Function_handler<void_(sqlite3_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/dkolmakov[P]hm/src/././database.hpp:52:13)>
       ::_M_manager;
  (this->db)._M_t.super___uniq_ptr_impl<sqlite3,_std::function<void_(sqlite3_*)>_>._M_t.
  super__Tuple_impl<0UL,_sqlite3_*,_std::function<void_(sqlite3_*)>_>.
  super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl = psVar3;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38.path._M_dataplus._M_p != paVar1) {
    operator_delete(local_38.path._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit Database(const std::string path)
      : db(
            [path]() {
              sqlite3* _db;
              int rc = sqlite3_open(path.c_str(), &_db);

              if (rc != SQLITE_OK) {
                throw SqliteException(
                    "can't open database: " + std::string(sqlite3_errmsg(_db)),
                    rc);
              }

              return _db;
            }(),
            [](sqlite3* _db) { sqlite3_close(_db); }) {}